

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

Offset<reflection::EnumVal>
reflection::CreateEnumVal
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,int64_t value,
          Offset<reflection::Type> union_type,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes)

{
  Offset<reflection::EnumVal> OVar1;
  EnumValBuilder builder_;
  EnumValBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  EnumValBuilder::add_value(&local_40,value);
  EnumValBuilder::add_attributes(&local_40,attributes);
  EnumValBuilder::add_documentation(&local_40,documentation);
  EnumValBuilder::add_union_type(&local_40,union_type);
  EnumValBuilder::add_name(&local_40,name);
  OVar1 = EnumValBuilder::Finish(&local_40);
  return (Offset<reflection::EnumVal>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<EnumVal> CreateEnumVal(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    int64_t value = 0,
    ::flatbuffers::Offset<reflection::Type> union_type = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0) {
  EnumValBuilder builder_(_fbb);
  builder_.add_value(value);
  builder_.add_attributes(attributes);
  builder_.add_documentation(documentation);
  builder_.add_union_type(union_type);
  builder_.add_name(name);
  return builder_.Finish();
}